

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::BottomLevelASVkImpl::BottomLevelASVkImpl
          (BottomLevelASVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,BottomLevelASDesc *Desc)

{
  BottomLevelASDesc *Args_1;
  VulkanPhysicalDevice *this_00;
  VulkanLogicalDevice *this_01;
  BLASTriangleDesc *pBVar1;
  BLASBoundingBoxDesc *pBVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer pVVar7;
  VkFormat VVar8;
  Uint32 UVar9;
  VkIndexType VVar10;
  VkBuildAccelerationStructureFlagsKHR VVar11;
  uint uVar12;
  uint32_t MemoryTypeIndex;
  VkResult errorCode;
  Uint32 *pUVar13;
  VkDeviceSize VVar14;
  VkDeviceAddress VVar15;
  void **ppvVar16;
  VkDeviceSize VVar17;
  ulong uVar18;
  char *pcVar19;
  Uint64 UVar20;
  ScratchBufferSizes SVar21;
  char (*in_stack_fffffffffffffe78) [35];
  VkMemoryRequirements MemReqs;
  uint local_14c;
  RenderDeviceVkImpl *local_148;
  Uint32 MaxPrimitiveCount;
  string msg_1;
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  vkGeometries;
  VkAccelerationStructureBuildGeometryInfoKHR vkBuildInfo;
  vector<unsigned_int,_std::allocator<unsigned_int>_> MaxPrimitiveCounts;
  Char *local_70;
  VkAccelerationStructureBuildSizesInfoKHR vkSizeInfo;
  
  BottomLevelASBase<Diligent::EngineVkImplTraits>::BottomLevelASBase
            (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,pRefCounters,
             pRenderDeviceVk,Desc,false);
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  .super_ObjectBase<Diligent::IBottomLevelASVk>.super_RefCountedObject<Diligent::IBottomLevelASVk>.
  super_IBottomLevelASVk.super_IBottomLevelAS.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00aef9d8;
  this->m_DeviceAddress = 0;
  (this->m_VulkanBLAS).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  *(undefined1 (*) [16])
   &(this->m_VulkanBLAS).m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount = (undefined1  [16])0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>)0x0;
  *(undefined1 (*) [16])&(this->m_VulkanBuffer).m_VkObject = (undefined1  [16])0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  this->m_MemoryAlignedOffset = 0;
  this_00 = (pRenderDeviceVk->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  this_01 = (pRenderDeviceVk->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  UVar20 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
           .m_Desc.CompactedSize;
  local_148 = pRenderDeviceVk;
  if (UVar20 != 0) goto LAB_0027d0f6;
  vkBuildInfo.ppGeometries = (VkAccelerationStructureGeometryKHR **)0x0;
  vkBuildInfo.scratchData = (VkDeviceOrHostAddressKHR)0x0;
  vkBuildInfo.geometryCount = 0;
  vkBuildInfo._52_4_ = 0;
  vkBuildInfo.pGeometries = (VkAccelerationStructureGeometryKHR *)0x0;
  vkBuildInfo.srcAccelerationStructure = (VkAccelerationStructureKHR)0x0;
  vkBuildInfo.dstAccelerationStructure = (VkAccelerationStructureKHR)0x0;
  vkBuildInfo.type = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
  vkBuildInfo.flags = 0;
  vkBuildInfo.mode = VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
  vkBuildInfo._28_4_ = 0;
  vkBuildInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkBuildInfo._4_4_ = 0;
  vkBuildInfo.pNext = (void *)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vkSizeInfo.buildScratchSize._0_4_ = 0;
  vkSizeInfo.buildScratchSize._4_4_ = 0;
  vkSizeInfo.accelerationStructureSize = 0;
  vkSizeInfo.updateScratchSize = 0;
  vkSizeInfo._4_12_ = SUB1612((undefined1  [16])0x0,4);
  vkSizeInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;
  std::
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>::
  resize(&vkGeometries,(ulong)Desc->BoxCount + (ulong)Desc->TriangleCount);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&MaxPrimitiveCounts,
             ((long)vkGeometries.
                    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)vkGeometries.
                    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  if ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
      .m_Desc.pTriangles == (BLASTriangleDesc *)0x0) {
    pBVar2 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
             .m_Desc.pBoxes;
    if (pBVar2 == (BLASBoundingBoxDesc *)0x0) {
      FormatString<char[45]>
                ((string *)&MemReqs,(char (*) [45])"Either pTriangles or pBoxes must not be null");
      DebugAssertionFailed
                ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                 ,0x81);
LAB_0027cf9e:
LAB_0027cfa7:
      if ((uint32_t *)MemReqs.size != &MemReqs.memoryTypeBits) {
        operator_delete((void *)MemReqs.size,MemReqs._16_8_ + 1);
      }
    }
    else {
      msg_1._M_dataplus._M_p = msg_1._M_dataplus._M_p & 0xffffffff00000000;
      if ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
          .m_Desc.BoxCount != 0) {
        pUVar13 = &pBVar2->MaxBoxCount;
        ppvVar16 = &((vkGeometries.
                      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                      ._M_impl.super__Vector_impl_data._M_start)->geometry).triangles.pNext;
        uVar18 = 0;
        do {
          *(undefined4 *)(ppvVar16 + -4) = 0x3b9d13f6;
          ppvVar16[-3] = (void *)0x0;
          *(undefined4 *)(ppvVar16 + -2) = 1;
          ((VkAccelerationStructureGeometryTrianglesDataKHR *)(ppvVar16 + -1))->sType =
               VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
          *ppvVar16 = (void *)0x0;
          UVar9 = *pUVar13;
          MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start[uVar18] = UVar9;
          uVar12 = UVar9 + (uint)msg_1._M_dataplus._M_p;
          msg_1._M_dataplus._M_p._0_4_ = uVar12;
          uVar18 = uVar18 + 1;
          pUVar13 = pUVar13 + 4;
          ppvVar16 = ppvVar16 + 0xc;
        } while (uVar18 < (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                          .m_Desc.BoxCount);
        if ((local_148->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
            MaxPrimitivesPerBLAS < uVar12) {
          FormatString<char[16],unsigned_int,char[25],unsigned_int,char[2]>
                    ((string *)&MemReqs,(Diligent *)"Max box count (",(char (*) [16])&msg_1,
                     (uint *)") exceeds device limit (",
                     (char (*) [25])
                     &(local_148->
                      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.
                      RayTracing.MaxPrimitivesPerBLAS,(uint *)0x920060,
                     (char (*) [2])in_stack_fffffffffffffe78);
          DebugAssertionFailed
                    ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                     ,0x7c);
          goto LAB_0027cf9e;
        }
      }
    }
  }
  else {
    MaxPrimitiveCount = 0;
    local_14c = 0;
    if ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
        .m_Desc.TriangleCount != 0) {
      do {
        pBVar1 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                 .m_Desc.pTriangles;
        uVar18 = (ulong)local_14c;
        pVVar7 = vkGeometries.
                 super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar18].sType =
             VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar18].pNext = (void *)0x0;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar18].geometryType =
             VK_GEOMETRY_TYPE_TRIANGLES_KHR;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar18].flags = 0;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar18].geometry.triangles.sType =
             VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar18].geometry.triangles.pNext = (void *)0x0;
        VVar8 = TypeToVkFormat(pBVar1[uVar18].VertexValueType,
                               (uint)pBVar1[uVar18].VertexComponentCount,
                               pBVar1[uVar18].VertexValueType < VT_FLOAT16);
        pVVar7[uVar18].geometry.triangles.vertexFormat = VVar8;
        UVar9 = pBVar1[uVar18].MaxVertexCount;
        if (UVar9 == 0) {
          FormatString<char[38]>
                    ((string *)&MemReqs,(char (*) [38])"MaxVertexCount must be greater than 0");
          DebugAssertionFailed
                    ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                     ,0x4b);
          if ((uint32_t *)MemReqs.size != &MemReqs.memoryTypeBits) {
            operator_delete((void *)MemReqs.size,MemReqs._16_8_ + 1);
          }
          UVar9 = pBVar1[uVar18].MaxVertexCount;
        }
        pVVar7[uVar18].geometry.triangles.maxVertex = UVar9 - 1;
        VVar10 = TypeToVkIndexType(pBVar1[uVar18].IndexType);
        pVVar7[uVar18].geometry.triangles.indexType = VVar10;
        *(ulong *)((long)&pVVar7[uVar18].geometry + 0x38) = (ulong)pBVar1[uVar18].AllowsTransforms;
        UVar9 = pBVar1[uVar18].MaxPrimitiveCount;
        MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[local_14c] = UVar9;
        MaxPrimitiveCount = MaxPrimitiveCount + UVar9;
        stack0xfffffffffffffe98 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )0x0;
        MemReqs._4_12_ = SUB1612((undefined1  [16])0x0,4);
        MemReqs.size._0_4_ = 0x3b9bb07a;
        (*vkGetPhysicalDeviceFormatProperties2KHR)
                  (this_00->m_VkDevice,pVVar7[uVar18].geometry.triangles.vertexFormat,
                   (VkFormatProperties2 *)&MemReqs);
        if (((undefined1  [16])stack0xfffffffffffffe98 & (undefined1  [16])0x20000000) ==
            (undefined1  [16])0x0) {
          local_70 = GetValueTypeString(pBVar1[uVar18].VertexValueType);
          FormatString<char[27],unsigned_int,char[20],char_const*,char[18],unsigned_int,char[25],unsigned_char,char[35]>
                    (&msg_1,(Diligent *)"combination of pTriangles[",(char (*) [27])&local_14c,
                     (uint *)"].VertexValueType (",(char (*) [20])&local_70,
                     (char **)") and pTriangles[",(char (*) [18])&local_14c,
                     (uint *)"].VertexComponentCount (",
                     (char (*) [25])&pBVar1[uVar18].VertexComponentCount,
                     (uchar *)") is not supported by this device.",in_stack_fffffffffffffe78);
          DebugAssertionFailed
                    (msg_1._M_dataplus._M_p,"BottomLevelASVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                     ,0x5d);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
            operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
          }
        }
        local_14c = local_14c + 1;
      } while (local_14c <
               (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
               .m_Desc.TriangleCount);
      if ((local_148->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
          MaxPrimitivesPerBLAS < MaxPrimitiveCount) {
        FormatString<char[23],unsigned_int,char[25],unsigned_int,char[2]>
                  ((string *)&MemReqs,(Diligent *)"Max primitives count (",
                   (char (*) [23])&MaxPrimitiveCount,(uint *)") exceeds device limit (",
                   (char (*) [25])
                   &(local_148->
                    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                    MaxPrimitivesPerBLAS,(uint *)0x920060,(char (*) [2])in_stack_fffffffffffffe78);
        DebugAssertionFailed
                  ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                   ,0x65);
        goto LAB_0027cfa7;
      }
    }
  }
  vkBuildInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
  VVar11 = BuildASFlagsToVkBuildAccelerationStructureFlags
                     ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                      .m_Desc.Flags);
  vkBuildInfo.flags = VVar11;
  vkBuildInfo.type = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;
  vkBuildInfo.pGeometries =
       vkGeometries.
       super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (int)((ulong)((long)vkGeometries.
                               super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)vkGeometries.
                              super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555;
  vkBuildInfo.geometryCount = uVar12;
  if ((local_148->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
      MaxGeometriesPerBLAS < uVar12) {
    FormatString<char[17],unsigned_int,char[25],unsigned_int,char[3]>
              ((string *)&MemReqs,(Diligent *)"Geometry count (",
               (char (*) [17])&vkBuildInfo.geometryCount,(uint *)") exceeds device limit (",
               (char (*) [25])
               &(local_148->
                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                MaxGeometriesPerBLAS,(uint *)0x91fe20,(char (*) [3])in_stack_fffffffffffffe78);
    DebugAssertionFailed
              ((Char *)MemReqs.size,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0x8b);
    if ((uint32_t *)MemReqs.size != &MemReqs.memoryTypeBits) {
      operator_delete((void *)MemReqs.size,MemReqs._16_8_ + 1);
    }
  }
  VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureBuildSizes
            (this_01,&vkBuildInfo,
             MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,&vkSizeInfo);
  UVar20 = vkSizeInfo.accelerationStructureSize;
  auVar3._8_4_ = (undefined4)vkSizeInfo.buildScratchSize;
  auVar3._0_8_ = vkSizeInfo.updateScratchSize;
  auVar3._12_4_ = vkSizeInfo.buildScratchSize._4_4_;
  SVar21.Build = auVar3._8_8_;
  SVar21.Update._0_4_ = (int)vkSizeInfo.updateScratchSize;
  SVar21.Update._4_4_ = (int)(vkSizeInfo.updateScratchSize >> 0x20);
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize = SVar21;
  if (MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(MaxPrimitiveCounts.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)MaxPrimitiveCounts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)MaxPrimitiveCounts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vkGeometries.
      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkGeometries.
                    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkGeometries.
                          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkGeometries.
                          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0027d0f6:
  Args_1 = &(this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
            .m_Desc;
  vkSizeInfo.accelerationStructureSize = 0;
  vkSizeInfo.buildScratchSize._4_4_ = 0;
  vkSizeInfo._4_12_ = SUB1612((undefined1  [16])0x0,4);
  vkSizeInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  vkSizeInfo.buildScratchSize._0_4_ = 0x120000;
  vkSizeInfo.updateScratchSize = UVar20;
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&vkBuildInfo,this_01,(VkBufferCreateInfo *)&vkSizeInfo,
             (Args_1->super_DeviceObjectAttribs).Name);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(&this->m_VulkanBuffer,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
            &vkBuildInfo);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
             &vkBuildInfo);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            (&MemReqs,this_01,(this->m_VulkanBuffer).m_VkObject);
  MemoryTypeIndex =
       VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex(this_00,MemReqs.memoryTypeBits,1);
  if ((MemReqs.alignment ^ MemReqs.alignment - 1) <= MemReqs.alignment - 1) {
    FormatString<char[29]>((string *)&vkBuildInfo,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              ((Char *)vkBuildInfo._0_8_,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa2);
    if ((VkAccelerationStructureTypeKHR *)vkBuildInfo._0_8_ != &vkBuildInfo.type) {
      operator_delete((void *)vkBuildInfo._0_8_,vkBuildInfo._16_8_ + 1);
    }
  }
  pcVar19 = (char *)(ulong)MemoryTypeIndex;
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)&vkBuildInfo,local_148,MemReqs.size,MemReqs.alignment,
             MemoryTypeIndex,2);
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)vkBuildInfo._0_8_;
  (this->m_MemoryAllocation).UnalignedOffset = (VkDeviceSize)vkBuildInfo.pNext;
  (this->m_MemoryAllocation).Size = vkBuildInfo._16_8_;
  vkBuildInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkBuildInfo._4_4_ = 0;
  vkBuildInfo.pNext = (void *)0x0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = vkBuildInfo._24_8_;
  vkBuildInfo._16_16_ = auVar4 << 0x40;
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
            ((VulkanMemoryAllocation *)&vkBuildInfo);
  if ((this->m_MemoryAllocation).Page == (VulkanMemoryPage *)0x0) {
    pcVar19 = "Failed to allocate memory for BLAS \'";
    LogError<true,char[37],char_const*,char[3]>
              (false,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa5,(char (*) [37])"Failed to allocate memory for BLAS \'",(char **)Args_1,
               (char (*) [3])"\'.");
  }
  VVar17 = (this->m_MemoryAllocation).UnalignedOffset;
  msg_1._M_dataplus._M_p = (pointer)MemReqs.alignment;
  VVar14 = VVar17;
  if ((MemReqs.alignment ^ MemReqs.alignment - 1) <= MemReqs.alignment - 1) {
    FormatString<char[12],unsigned_long,char[23]>
              ((string *)&vkBuildInfo,(Diligent *)"Alignment (",(char (*) [12])&msg_1,
               (unsigned_long *)") must be a power of 2",(char (*) [23])pcVar19);
    DebugAssertionFailed
              ((Char *)vkBuildInfo._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((VkAccelerationStructureTypeKHR *)vkBuildInfo._0_8_ != &vkBuildInfo.type) {
      operator_delete((void *)vkBuildInfo._0_8_,vkBuildInfo._16_8_ + 1);
    }
    VVar14 = (this->m_MemoryAllocation).UnalignedOffset;
  }
  VVar17 = -(long)msg_1._M_dataplus._M_p & (ulong)(msg_1._M_dataplus._M_p + (VVar17 - 1));
  this->m_MemoryAlignedOffset = VVar17;
  if ((this->m_MemoryAllocation).Size < (MemReqs.size + VVar17) - VVar14) {
    FormatString<char[39]>
              ((string *)&vkBuildInfo,(char (*) [39])"Size of memory allocation is too small");
    DebugAssertionFailed
              ((Char *)vkBuildInfo._0_8_,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa8);
    if ((VkAccelerationStructureTypeKHR *)vkBuildInfo._0_8_ != &vkBuildInfo.type) {
      operator_delete((void *)vkBuildInfo._0_8_,vkBuildInfo._16_8_ + 1);
    }
    VVar17 = this->m_MemoryAlignedOffset;
  }
  errorCode = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_01,(this->m_VulkanBuffer).m_VkObject,
                         (((this->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject,VVar17);
  if (errorCode != VK_SUCCESS) {
    pcVar19 = VulkanUtilities::VkResultToString(errorCode);
    vkBuildInfo._0_8_ = pcVar19;
    LogError<true,char[29],char[17],char_const*>
              (false,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xab,(char (*) [29])"Failed to bind buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)&vkBuildInfo);
  }
  vkBuildInfo._4_12_ = SUB1612((undefined1  [16])0x0,4);
  vkBuildInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->m_VulkanBuffer).m_VkObject;
  vkBuildInfo._16_16_ = auVar5 << 0x40;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = UVar20;
  vkBuildInfo._32_16_ = auVar6 << 0x40;
  vkBuildInfo._52_12_ = SUB1612((undefined1  [16])0x0,4);
  vkBuildInfo.geometryCount = 1;
  VulkanUtilities::VulkanLogicalDevice::CreateAccelStruct
            ((AccelStructWrapper *)&msg_1,this_01,
             (VkAccelerationStructureCreateInfoKHR *)&vkBuildInfo,
             (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  operator=(&this->m_VulkanBLAS,
            (VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
             *)&msg_1);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
              *)&msg_1);
  VVar15 = VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress
                     (this_01,(this->m_VulkanBLAS).m_VkObject);
  this->m_DeviceAddress = VVar15;
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_State =
       RESOURCE_STATE_BUILD_AS_READ;
  return;
}

Assistant:

BottomLevelASVkImpl::BottomLevelASVkImpl(IReferenceCounters*      pRefCounters,
                                         RenderDeviceVkImpl*      pRenderDeviceVk,
                                         const BottomLevelASDesc& Desc) :
    TBottomLevelASBase{pRefCounters, pRenderDeviceVk, Desc}
{
    const auto& LogicalDevice   = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    const auto& RTProps         = pRenderDeviceVk->GetAdapterInfo().RayTracing;
    auto        AccelStructSize = m_Desc.CompactedSize;

    if (AccelStructSize == 0)
    {
        VkAccelerationStructureBuildGeometryInfoKHR     vkBuildInfo{};
        std::vector<VkAccelerationStructureGeometryKHR> vkGeometries;
        std::vector<uint32_t>                           MaxPrimitiveCounts;
        VkAccelerationStructureBuildSizesInfoKHR        vkSizeInfo{};
        vkSizeInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;

        vkGeometries.resize(size_t{Desc.TriangleCount} + size_t{Desc.BoxCount});
        MaxPrimitiveCounts.resize(vkGeometries.size());

        if (m_Desc.pTriangles != nullptr)
        {
            Uint32 MaxPrimitiveCount = 0;
            for (uint32_t i = 0; i < m_Desc.TriangleCount; ++i)
            {
                auto& src = m_Desc.pTriangles[i];
                auto& dst = vkGeometries[i];
                auto& tri = dst.geometry.triangles;

                dst.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
                dst.pNext        = nullptr;
                dst.geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
                dst.flags        = 0;

                tri.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
                tri.pNext        = nullptr;
                tri.vertexFormat = TypeToVkFormat(src.VertexValueType, src.VertexComponentCount, src.VertexValueType < VT_FLOAT16);
                // maxVertex is the number of vertices in vertexData minus one.
                VERIFY(src.MaxVertexCount > 0, "MaxVertexCount must be greater than 0");
                tri.maxVertex = src.MaxVertexCount - 1;
                tri.indexType = TypeToVkIndexType(src.IndexType);
                // Non-null address indicates that non-null transform data will be provided to the build command.
                tri.transformData.deviceAddress = src.AllowsTransforms ? 1 : 0;
                MaxPrimitiveCounts[i]           = src.MaxPrimitiveCount;

                MaxPrimitiveCount += src.MaxPrimitiveCount;

#ifdef DILIGENT_DEVELOPMENT
#    if DILIGENT_USE_VOLK
                {
                    VkFormatProperties2 vkProps{};
                    vkProps.sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_2;
                    vkGetPhysicalDeviceFormatProperties2KHR(PhysicalDevice.GetVkDeviceHandle(), tri.vertexFormat, &vkProps);

                    DEV_CHECK_ERR((vkProps.formatProperties.bufferFeatures & VK_FORMAT_FEATURE_ACCELERATION_STRUCTURE_VERTEX_BUFFER_BIT_KHR) != 0,
                                  "combination of pTriangles[", i, "].VertexValueType (", GetValueTypeString(src.VertexValueType),
                                  ") and pTriangles[", i, "].VertexComponentCount (", src.VertexComponentCount, ") is not supported by this device.");
                }
#    else
                UNSUPPORTED("vkGetPhysicalDeviceFormatProperties2KHR is only available through Volk");
#    endif
#endif
            }
            DEV_CHECK_ERR(MaxPrimitiveCount <= RTProps.MaxPrimitivesPerBLAS,
                          "Max primitives count (", MaxPrimitiveCount, ") exceeds device limit (", RTProps.MaxPrimitivesPerBLAS, ")");
            (void)MaxPrimitiveCount;
        }
        else if (m_Desc.pBoxes != nullptr)
        {
            Uint32 MaxBoxCount = 0;
            for (uint32_t i = 0; i < m_Desc.BoxCount; ++i)
            {
                auto& src = m_Desc.pBoxes[i];
                auto& dst = vkGeometries[i];
                auto& box = dst.geometry.aabbs;

                dst.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
                dst.pNext        = nullptr;
                dst.geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;

                box.sType             = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
                box.pNext             = nullptr;
                MaxPrimitiveCounts[i] = src.MaxBoxCount;

                MaxBoxCount += src.MaxBoxCount;
            }
            DEV_CHECK_ERR(MaxBoxCount <= RTProps.MaxPrimitivesPerBLAS,
                          "Max box count (", MaxBoxCount, ") exceeds device limit (", RTProps.MaxPrimitivesPerBLAS, ")");
            (void)MaxBoxCount;
        }
        else
        {
            UNEXPECTED("Either pTriangles or pBoxes must not be null");
        }

        vkBuildInfo.sType         = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
        vkBuildInfo.flags         = BuildASFlagsToVkBuildAccelerationStructureFlags(m_Desc.Flags);
        vkBuildInfo.type          = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;
        vkBuildInfo.pGeometries   = vkGeometries.data();
        vkBuildInfo.geometryCount = static_cast<uint32_t>(vkGeometries.size());

        DEV_CHECK_ERR(vkBuildInfo.geometryCount <= RTProps.MaxGeometriesPerBLAS, "Geometry count (", vkBuildInfo.geometryCount,
                      ") exceeds device limit (", RTProps.MaxGeometriesPerBLAS, ").");

        LogicalDevice.GetAccelerationStructureBuildSizes(vkBuildInfo, MaxPrimitiveCounts.data(), vkSizeInfo);

        AccelStructSize      = vkSizeInfo.accelerationStructureSize;
        m_ScratchSize.Build  = vkSizeInfo.buildScratchSize;
        m_ScratchSize.Update = vkSizeInfo.updateScratchSize;
    }

    VkBufferCreateInfo vkBuffCI{};
    vkBuffCI.sType                 = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    vkBuffCI.flags                 = 0;
    vkBuffCI.size                  = AccelStructSize;
    vkBuffCI.usage                 = VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_STORAGE_BIT_KHR | VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
    vkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    vkBuffCI.queueFamilyIndexCount = 0;
    vkBuffCI.pQueueFamilyIndices   = nullptr;

    m_VulkanBuffer = LogicalDevice.CreateBuffer(vkBuffCI, m_Desc.Name);

    VkMemoryRequirements MemReqs         = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);
    uint32_t             MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

    VERIFY(IsPowerOfTwo(MemReqs.alignment), "Alignment is not power of 2!");
    m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, MemReqs.alignment, MemoryTypeIndex, VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for BLAS '", m_Desc.Name, "'.");

    m_MemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, MemReqs.alignment);
    VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_MemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
    auto Memory = m_MemoryAllocation.Page->GetVkMemory();
    auto err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_MemoryAlignedOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

    VkAccelerationStructureCreateInfoKHR vkAccelStrCI{};
    vkAccelStrCI.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
    vkAccelStrCI.createFlags = 0;
    vkAccelStrCI.buffer      = m_VulkanBuffer;
    vkAccelStrCI.offset      = 0;
    vkAccelStrCI.size        = AccelStructSize;
    vkAccelStrCI.type        = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;

    m_VulkanBLAS = LogicalDevice.CreateAccelStruct(vkAccelStrCI, m_Desc.Name);

    m_DeviceAddress = LogicalDevice.GetAccelerationStructureDeviceAddress(m_VulkanBLAS);

    SetState(RESOURCE_STATE_BUILD_AS_READ);
}